

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_event_visitor.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::visit_begin_object
          (basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *this,
          semantic_tag tag,ser_context *context,error_code *ec)

{
  bool bVar1;
  target_t tVar2;
  reference pvVar3;
  size_t sVar4;
  vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
  *in_RDI;
  error_code *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  semantic_tag tag_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  pvVar3 = std::
           vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
           ::back(in_RDI);
  bVar1 = level::is_key(pvVar3);
  if (bVar1) {
    pvVar3 = std::
             vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
             ::back(in_RDI);
    tVar2 = level::target(pvVar3);
    if (tVar2 == buffer) {
      pvVar3 = std::
               vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
               ::back(in_RDI);
      sVar4 = level::count(pvVar3);
      if (sVar4 != 0) {
        std::__cxx11::string::push_back((char)in_RDI + '8');
      }
    }
    std::
    vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::level,std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::level>>
    ::
    emplace_back<jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::target_t,jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::container_t>
              ((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (target_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (container_t *)in_RDI);
    std::__cxx11::string::push_back((char)in_RDI + '8');
  }
  else {
    pvVar3 = std::
             vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
             ::back(in_RDI);
    tVar2 = level::target(pvVar3);
    if (tVar2 == buffer) {
      std::
      vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::level,std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::level>>
      ::
      emplace_back<jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::target_t,jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::container_t>
                ((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                  *)0x100000002,
                 (target_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 (container_t *)in_RDI);
      std::__cxx11::string::push_back((char)in_RDI + '8');
    }
    else {
      tag_00 = none;
      std::
      vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::level,std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::level>>
      ::
      emplace_back<jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::target_t,jsoncons::basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>::container_t>
                ((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                  *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(target_t *)0x2,
                 (container_t *)in_RDI);
      basic_json_visitor<char>::begin_object
                ((basic_json_visitor<char> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),tag_00,
                 (ser_context *)in_RDI,in_stack_ffffffffffffffb8);
    }
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_object(semantic_tag tag, const ser_context& context, std::error_code& ec) override
        {
            if (level_stack_.back().is_key())
            {
                if (level_stack_.back().target() == target_t::buffer && level_stack_.back().count() > 0)
                {
                    key_buffer_.push_back(',');
                }
                level_stack_.emplace_back(target_t::buffer, container_t::object);
                key_buffer_.push_back('{');
            }
            else
            {
                switch (level_stack_.back().target())
                {
                    case target_t::buffer:
                        level_stack_.emplace_back(target_t::buffer, container_t::object);
                        key_buffer_.push_back('{');
                        break;
                    default:
                        level_stack_.emplace_back(target_t::destination, container_t::object);
                        destination_->begin_object(tag, context, ec);
                        break;
                }
            }
            JSONCONS_VISITOR_RETURN;
        }